

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O0

int parse_integer(char *buffer,int num_digits,int use_leading_spaces,int *value)

{
  bool bVar1;
  int *value_local;
  int use_leading_spaces_local;
  int num_digits_local;
  char *buffer_local;
  
  value_local._4_4_ = num_digits;
  _use_leading_spaces_local = buffer;
  if (use_leading_spaces != 0) {
    while( true ) {
      bVar1 = false;
      if (1 < value_local._4_4_) {
        bVar1 = *_use_leading_spaces_local == ' ';
      }
      if (!bVar1) break;
      _use_leading_spaces_local = _use_leading_spaces_local + 1;
      value_local._4_4_ = value_local._4_4_ + -1;
    }
  }
  *value = 0;
  while( true ) {
    if (value_local._4_4_ < 1) {
      return 0;
    }
    if ((*_use_leading_spaces_local < '0') || ('9' < *_use_leading_spaces_local)) break;
    *value = *value * 10 + *_use_leading_spaces_local + -0x30;
    _use_leading_spaces_local = _use_leading_spaces_local + 1;
    value_local._4_4_ = value_local._4_4_ + -1;
  }
  return -1;
}

Assistant:

static int parse_integer(const char *buffer, int num_digits, int use_leading_spaces, int *value)
{
    if (use_leading_spaces)
    {
        while (num_digits > 1 && *buffer == ' ')
        {
            buffer++;
            num_digits--;
        }
    }
    *value = 0;
    while (num_digits > 0)
    {
        if (*buffer < '0' || *buffer > '9')
        {
            return -1;
        }
        *value = (*value) * 10 + (*buffer - '0');
        buffer++;
        num_digits--;
    }

    return 0;
}